

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode format_convert(SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 uVar9;
  SUNMatrix in_RSI;
  long *in_RDI;
  sunindextype temp_1;
  sunindextype dest;
  sunindextype jj;
  sunindextype temp;
  sunindextype last;
  sunindextype row;
  sunindextype csum;
  sunindextype col;
  sunindextype n;
  sunindextype nnz;
  sunindextype n_col;
  sunindextype n_row;
  sunindextype *Bi;
  sunindextype *Bp;
  sunindextype *Aj;
  sunindextype *Ap;
  sunrealtype *Bx;
  sunrealtype *Ax;
  SUNContext_conflict sunctx_local_scope_;
  long local_c0;
  SUNMatrix in_stack_ffffffffffffff48;
  long lVar10;
  SUNMatrix in_stack_ffffffffffffff50;
  long local_a0;
  undefined8 local_90;
  long local_88;
  long local_80;
  long local_78;
  long local_70;
  
  if (*(int *)(*in_RDI + 0x28) == *(int *)((long)in_RSI->content + 0x28)) {
    SUNMatCopy_Sparse(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  else {
    lVar1 = *(long *)(*in_RDI + 0x38);
    lVar2 = *(long *)(*in_RDI + 0x30);
    lVar3 = *(long *)(*in_RDI + 0x20);
    if (*(int *)(*in_RDI + 0x28) == 1) {
      lVar10 = *(long *)*in_RDI;
    }
    else {
      lVar10 = *(long *)(*in_RDI + 8);
    }
    if (*(int *)(*in_RDI + 0x28) == 1) {
      local_c0 = *(long *)(*in_RDI + 8);
    }
    else {
      local_c0 = *(long *)*in_RDI;
    }
    lVar4 = *(long *)((long)in_RSI->content + 0x38);
    lVar5 = *(long *)((long)in_RSI->content + 0x30);
    lVar6 = *(long *)((long)in_RSI->content + 0x20);
    lVar7 = *(long *)(lVar1 + lVar10 * 8);
    SUNMatZero_Sparse(in_RSI);
    for (local_70 = 0; local_70 < lVar7; local_70 = local_70 + 1) {
      lVar8 = *(long *)(lVar2 + local_70 * 8);
      *(long *)(lVar4 + lVar8 * 8) = *(long *)(lVar4 + lVar8 * 8) + 1;
    }
    local_80 = 0;
    for (local_78 = 0; local_78 < local_c0; local_78 = local_78 + 1) {
      lVar8 = *(long *)(lVar4 + local_78 * 8);
      *(long *)(lVar4 + local_78 * 8) = local_80;
      local_80 = lVar8 + local_80;
    }
    *(long *)(lVar4 + local_c0 * 8) = lVar7;
    for (local_88 = 0; local_88 < lVar10; local_88 = local_88 + 1) {
      for (local_a0 = *(long *)(lVar1 + local_88 * 8);
          local_a0 < *(long *)(lVar1 + 8 + local_88 * 8); local_a0 = local_a0 + 1) {
        lVar7 = *(long *)(lVar2 + local_a0 * 8);
        lVar8 = *(long *)(lVar4 + lVar7 * 8);
        *(long *)(lVar5 + lVar8 * 8) = local_88;
        *(undefined8 *)(lVar6 + lVar8 * 8) = *(undefined8 *)(lVar3 + local_a0 * 8);
        *(long *)(lVar4 + lVar7 * 8) = *(long *)(lVar4 + lVar7 * 8) + 1;
      }
    }
    local_90 = 0;
    for (local_78 = 0; local_78 <= local_c0; local_78 = local_78 + 1) {
      uVar9 = *(undefined8 *)(lVar4 + local_78 * 8);
      *(undefined8 *)(lVar4 + local_78 * 8) = local_90;
      local_90 = uVar9;
    }
  }
  return 0;
}

Assistant:

SUNErrCode format_convert(const SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);

  sunrealtype *Ax, *Bx;
  sunindextype *Ap, *Aj;
  sunindextype *Bp, *Bi;
  sunindextype n_row, n_col, nnz;
  sunindextype n, col, csum, row, last;

  if (SM_SPARSETYPE_S(A) == SM_SPARSETYPE_S(B))
  {
    SUNCheckCall(SUNMatCopy_Sparse(A, B));
    return SUN_SUCCESS;
  }

  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Aj = SM_INDEXVALS_S(A);
  SUNAssert(Aj, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  n_row = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_ROWS_S(A) : SM_COLUMNS_S(A);
  n_col = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_COLUMNS_S(A) : SM_ROWS_S(A);

  Bp = SM_INDEXPTRS_S(B);
  Bi = SM_INDEXVALS_S(B);
  Bx = SM_DATA_S(B);

  nnz = Ap[n_row];

  SUNCheckCall(SUNMatZero_Sparse(B));

  /* compute number of non-zero entries per column (if CSR) or per row (if CSC)
   * of A */
  for (n = 0; n < nnz; n++) { Bp[Aj[n]]++; }

  /* cumualtive sum the nnz per column to get Bp[] */
  for (col = 0, csum = 0; col < n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = csum;
    csum += temp;
  }
  Bp[n_col] = nnz;

  for (row = 0; row < n_row; row++)
  {
    sunindextype jj;
    for (jj = Ap[row]; jj < Ap[row + 1]; jj++)
    {
      col               = Aj[jj];
      sunindextype dest = Bp[col];

      Bi[dest] = row;
      Bx[dest] = Ax[jj];

      Bp[col]++;
    }
  }

  for (col = 0, last = 0; col <= n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = last;
    last              = temp;
  }

  return SUN_SUCCESS;
}